

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

bool __thiscall
duckdb_shell::ShellState::SetOutputFile(ShellState *this,char **azArg,idx_t nArg,char output_mode)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  char *__s1;
  bool bVar4;
  uint bTextMode;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  int local_54;
  
  if (safe_mode == '\x01') {
    fwrite(".output/.once/.excel cannot be used in -safe mode\n",0x32,1,_stderr);
LAB_001e5343:
    bVar4 = false;
  }
  else {
    local_54 = 2;
    if (output_mode == 'e') {
      local_54 = 2;
      iVar2 = 0x78;
    }
    else if (output_mode == 'o') {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      local_54 = 0;
    }
    pcVar5 = (char *)0x0;
    bVar4 = false;
    for (uVar6 = 1; uVar6 < nArg; uVar6 = uVar6 + 1) {
      pcVar7 = azArg[uVar6];
      if (*pcVar7 == '-') {
        __s1 = pcVar7;
        if (pcVar7[1] == '-') {
          __s1 = pcVar7 + 1;
        }
        iVar1 = strcmp(__s1,"-bom");
        if (iVar1 == 0) {
          bVar4 = true;
        }
        else {
          if (output_mode == 'e') {
LAB_001e520c:
            pFVar3 = (FILE *)this->out;
            pcVar5 = "ERROR: unknown option: \"%s\".  Usage:\n";
LAB_001e5234:
            fprintf(pFVar3,pcVar5,pcVar7);
            showHelp(this->out,*azArg);
            return false;
          }
          if ((__s1[1] == 'x') && (__s1[2] == '\0')) {
            iVar2 = 0x78;
          }
          else if ((__s1[1] != 'e') || (iVar2 = 0x65, __s1[2] != '\0')) goto LAB_001e520c;
        }
      }
      else {
        bVar8 = pcVar5 != (char *)0x0;
        pcVar5 = pcVar7;
        if (bVar8) {
          pFVar3 = (FILE *)this->out;
          pcVar5 = "ERROR: extra parameter: \"%s\".  Usage:\n";
          goto LAB_001e5234;
        }
      }
    }
    pcVar7 = "stdout";
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
    }
    this->outCount = local_54;
    ResetOutput(this);
    if ((iVar2 == 0x78) || (bTextMode = 0, iVar2 == 0x65)) {
      this->doXdgOpen = '\x01';
      PushOutputMode(this);
      if (iVar2 != 0x78) {
        NewTempFile(this,"txt");
      }
      else {
        NewTempFile(this,"csv");
        *(byte *)&this->shellFlgs = (byte)this->shellFlgs & 0xbf;
        this->mode = CSV;
        std::__cxx11::string::assign((char *)&this->colSeparator);
        std::__cxx11::string::assign((char *)&this->rowSeparator);
      }
      bTextMode = (uint)(iVar2 != 0x78);
      pcVar7 = this->zTempFile;
    }
    if (*pcVar7 == '|') {
      pFVar3 = popen(pcVar7 + 1,"w");
      this->out = (FILE *)pFVar3;
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open pipe \"%s\"\n",pcVar7 + 1);
        this->out = _stdout;
        return false;
      }
    }
    else {
      pFVar3 = (FILE *)output_file_open(pcVar7,bTextMode);
      this->out = (FILE *)pFVar3;
      if (pFVar3 == (FILE *)0x0) {
        iVar2 = strcmp(pcVar7,"off");
        if (iVar2 != 0) {
          fprintf(_stderr,"Error: cannot write to \"%s\"\n",pcVar7);
        }
        this->out = _stdout;
        goto LAB_001e5343;
      }
    }
    if (bVar4) {
      fwrite(anon_var_dwarf_afbf,3,1,pFVar3);
    }
    std::__cxx11::string::assign((char *)&this->outfile);
    stdout_is_console = false;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ShellState::SetOutputFile(const char **azArg, idx_t nArg, char output_mode) {
	if (safe_mode) {
		utf8_printf(stderr, ".output/.once/.excel cannot be used in -safe mode\n");
		return false;
	}
	const char *zFile = nullptr;
	int bTxtMode = 0;
	int eMode = 0;
	bool bBOM = false;
	int bOnce = 0; /* 0: .output, 1: .once, 2: .excel */

	if (output_mode == 'e') {
		// .excel
		eMode = 'x';
		bOnce = 2;
	} else if (output_mode == 'o') {
		// .once
		bOnce = 1;
	}
	for (idx_t i = 1; i < nArg; i++) {
		const char *z = azArg[i];
		if (z[0] == '-') {
			if (z[1] == '-') {
				z++;
			}
			if (strcmp(z, "-bom") == 0) {
				bBOM = true;
			} else if (output_mode != 'e' && strcmp(z, "-x") == 0) {
				eMode = 'x'; /* spreadsheet */
			} else if (output_mode != 'e' && strcmp(z, "-e") == 0) {
				eMode = 'e'; /* text editor */
			} else {
				utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", azArg[i]);
				showHelp(out, azArg[0]);
				return false;
			}
		} else if (!zFile) {
			zFile = z;
		} else {
			utf8_printf(out, "ERROR: extra parameter: \"%s\".  Usage:\n", azArg[i]);
			showHelp(out, azArg[0]);
			return false;
		}
	}
	if (!zFile) {
		zFile = "stdout";
	}
	if (bOnce) {
		outCount = 2;
	} else {
		outCount = 0;
	}
	ResetOutput();
#ifndef SQLITE_NOHAVE_SYSTEM
	if (eMode == 'e' || eMode == 'x') {
		doXdgOpen = 1;
		PushOutputMode();
		if (eMode == 'x') {
			/* spreadsheet mode.  Output as CSV. */
			NewTempFile("csv");
			ShellClearFlag(SHFLG_Echo);
			mode = RenderMode::CSV;
			colSeparator = SEP_Comma;
			rowSeparator = SEP_CrLf;
		} else {
			/* text editor mode */
			NewTempFile("txt");
			bTxtMode = 1;
		}
		zFile = zTempFile;
	}
#endif /* SQLITE_NOHAVE_SYSTEM */
	if (zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		out = stdout;
		return false;
#else
		out = popen(zFile + 1, "w");
		if (out == 0) {
			utf8_printf(stderr, "Error: cannot open pipe \"%s\"\n", zFile + 1);
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
#endif
	} else {
		out = output_file_open(zFile, bTxtMode);
		if (!out) {
			if (strcmp(zFile, "off") != 0) {
				utf8_printf(stderr, "Error: cannot write to \"%s\"\n", zFile);
			}
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
	}
	stdout_is_console = false;
	return true;
}